

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O0

void __thiscall
UIDisplayer::drawParagraphAtCoords
          (UIDisplayer *this,Vec2d coords,string *textToDisplay,GLfloat pixelSize,Colour *colour,
          bool rotateColours)

{
  GLfloat *pGVar1;
  float fVar2;
  float fVar3;
  bool rotateColours_local;
  Colour *colour_local;
  GLfloat pixelSize_local;
  string *textToDisplay_local;
  UIDisplayer *this_local;
  Vec2d coords_local;
  
  this_local = (UIDisplayer *)coords;
  glPushMatrix();
  fVar2 = Vec2d::getX((Vec2d *)&this_local);
  fVar3 = Vec2d::getY((Vec2d *)&this_local);
  glTranslatef(fVar2,fVar3,0);
  pGVar1 = Colour::getColour3fv(colour);
  glColor3fv(pGVar1);
  TextDisplayer::writeText(this->textDisplayer,textToDisplay,(int)pixelSize,rotateColours);
  glPopMatrix();
  return;
}

Assistant:

void UIDisplayer::drawParagraphAtCoords(Vec2d coords, const string& textToDisplay, GLfloat pixelSize, Colour* colour, bool rotateColours) {
    glPushMatrix();
        glTranslatef(coords.getX(), coords.getY(), 0.f);
        glColor3fv(colour->getColour3fv());
        textDisplayer->writeText(textToDisplay, pixelSize, rotateColours);
    glPopMatrix();
}